

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoind.cpp
# Opt level: O0

bool ProcessInitCommands(ArgsManager *args)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string strUsage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  string *in_stack_fffffffffffffe98;
  string *strArg;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  undefined7 in_stack_fffffffffffffeb8;
  byte bVar3;
  undefined1 in_stack_fffffffffffffec0 [16];
  undefined5 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  byte bVar4;
  undefined2 in_stack_fffffffffffffef6;
  ArgsManager *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = HelpRequested((ArgsManager *)
                        CONCAT26(in_stack_fffffffffffffef6,
                                 CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0)));
  bVar3 = 1;
  bVar4 = bVar3;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0._8_8_,in_stack_fffffffffffffec0._0_8_,
               (allocator<char> *)CONCAT17(bVar3,in_stack_fffffffffffffeb8));
    bVar3 = ArgsManager::IsArgSet
                      ((ArgsManager *)
                       CONCAT17(in_stack_fffffffffffffea7,
                                CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                       in_stack_fffffffffffffe98);
    in_stack_fffffffffffffea7 = bVar3;
    bVar4 = bVar3;
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  }
  if ((bVar3 & 1) == 0) {
    bVar4 = 0;
  }
  else {
    strArg = (string *)&stack0xffffffffffffff78;
    FormatFullVersion_abi_cxx11_();
    std::operator+((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffef6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0._8_8_,in_stack_fffffffffffffec0._0_8_,
               (allocator<char> *)CONCAT17(bVar4,in_stack_fffffffffffffeb8));
    bVar4 = ArgsManager::IsArgSet
                      ((ArgsManager *)
                       CONCAT17(in_stack_fffffffffffffea7,CONCAT16(bVar3,in_stack_fffffffffffffea0))
                       ,strArg);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef6);
    if ((bVar4 & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(char *)CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffe86,
                                                        in_stack_fffffffffffffe80)));
      ArgsManager::GetHelpMessage_abi_cxx11_(in_stack_ffffffffffffff68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)
                                ));
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    }
    else {
      LicenseInfo_abi_cxx11_();
      std::__cxx11::string::operator_cast_to_basic_string_view(strArg);
      FormatParagraph_abi_cxx11_
                ((string_view)in_stack_ffffffffffffff88,in_stack_ffffffffffffff70,
                 (size_t)in_stack_ffffffffffffff68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)
                                ));
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    }
    tinyformat::format<std::__cxx11::string>
              ((ostream *)
               CONCAT17(in_stack_fffffffffffffea7,CONCAT16(bVar3,in_stack_fffffffffffffea0)),
               (char *)strArg,args_00);
    bVar4 = 1;
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool ProcessInitCommands(ArgsManager& args)
{
    // Process help and version before taking care about datadir
    if (HelpRequested(args) || args.IsArgSet("-version")) {
        std::string strUsage = PACKAGE_NAME " version " + FormatFullVersion() + "\n";

        if (args.IsArgSet("-version")) {
            strUsage += FormatParagraph(LicenseInfo());
        } else {
            strUsage += "\nUsage:  bitcoind [options]                     Start " PACKAGE_NAME "\n"
                "\n";
            strUsage += args.GetHelpMessage();
        }

        tfm::format(std::cout, "%s", strUsage);
        return true;
    }

    return false;
}